

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCore.c
# Opt level: O0

int If_ManPerformMappingComb(If_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  If_Obj_t *pObj_00;
  abctime aVar3;
  float local_3c;
  int local_24;
  int i;
  abctime clkTotal;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(p->vCis,local_24);
    if (p->pPars->pTimesArr == (float *)0x0) {
      local_3c = 0.0;
    }
    else {
      local_3c = p->pPars->pTimesArr[local_24];
    }
    If_ObjSetArrTime(pObj_00,local_3c);
    pObj_00->EstRefs = 1.0;
  }
  if ((p->pPars->fPreprocess == 0) || (p->pPars->fArea != 0)) {
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,0,1,"Delay");
  }
  else {
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,1,"Delay");
    p->pPars->fFancy = 1;
    If_ManResetOriginalRefs(p);
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,0,"Delay-2");
    p->pPars->fFancy = 0;
    p->pPars->fArea = 1;
    If_ManResetOriginalRefs(p);
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,0,"Area");
    p->pPars->fArea = 0;
  }
  if (p->pPars->fExpRed != 0) {
    If_ManImproveMapping(p);
  }
  for (local_24 = 0; local_24 < p->pPars->nFlowIters; local_24 = local_24 + 1) {
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,1,0,0,"Flow");
    if (p->pPars->fExpRed != 0) {
      If_ManImproveMapping(p);
    }
  }
  for (local_24 = 0; local_24 < p->pPars->nAreaIters; local_24 = local_24 + 1) {
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,2,0,0,"Area");
    if (p->pPars->fExpRed != 0) {
      If_ManImproveMapping(p);
    }
  }
  if (p->pPars->fVerbose != 0) {
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Total time",aVar3 - aVar2);
  }
  aVar3 = Abc_Clock();
  s_MappingTime = aVar3 - aVar2;
  p->pPars->FinalDelay = p->RequiredGlo;
  p->pPars->FinalArea = p->AreaGlo;
  return 1;
}

Assistant:

int If_ManPerformMappingComb( If_Man_t * p )
{
    If_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i;

    // set arrival times and fanout estimates
    If_ManForEachCi( p, pObj, i )
    {
        If_ObjSetArrTime( pObj, p->pPars->pTimesArr ? p->pPars->pTimesArr[i] : (float)0.0 );
        pObj->EstRefs = (float)1.0;
    }

    // delay oriented mapping
    if ( p->pPars->fPreprocess && !p->pPars->fArea )
    {
        // map for delay
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 1, "Delay" );
        // map for delay second option
        p->pPars->fFancy = 1;
        If_ManResetOriginalRefs( p );
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 0, "Delay-2" );
        p->pPars->fFancy = 0;
        // map for area
        p->pPars->fArea = 1;
        If_ManResetOriginalRefs( p );
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 0, "Area" );
        p->pPars->fArea = 0;
    }
    else
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 0, 1, "Delay" );

    // try to improve area by expanding and reducing the cuts
    if ( p->pPars->fExpRed )
        If_ManImproveMapping( p );

    // area flow oriented mapping
    for ( i = 0; i < p->pPars->nFlowIters; i++ )
    {
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 1, 0, 0, "Flow" );
        if ( p->pPars->fExpRed )
            If_ManImproveMapping( p );
    }

    // area oriented mapping
    for ( i = 0; i < p->pPars->nAreaIters; i++ )
    {
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 2, 0, 0, "Area" );
        if ( p->pPars->fExpRed )
            If_ManImproveMapping( p );
    }

    if ( p->pPars->fVerbose )
    {
//        Abc_Print( 1, "Total memory = %7.2f MB. Peak cut memory = %7.2f MB.  ", 
//            1.0 * (p->nObjBytes + 2*sizeof(void *)) * If_ManObjNum(p) / (1<<20), 
//            1.0 * p->nSetBytes * Mem_FixedReadMaxEntriesUsed(p->pMemSet) / (1<<20) );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clkTotal );
    }
//    Abc_Print( 1, "Cross cut memory = %d.\n", Mem_FixedReadMaxEntriesUsed(p->pMemSet) );
    s_MappingTime = Abc_Clock() - clkTotal;
//    Abc_Print( 1, "Special POs = %d.\n", If_ManCountSpecialPos(p) );

/*
    {
        static char * pLastName = NULL;
        FILE * pTable = fopen( "fpga/ucsb/stats.txt", "a+" );
        if ( pLastName == NULL || strcmp(pLastName, p->pName) )
        {
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );

            fprintf( pTable, "%d ", If_ManCiNum(p) );
            fprintf( pTable, "%d ", If_ManCoNum(p) );
            fprintf( pTable, "%d ", If_ManAndNum(p) );

            ABC_FREE( pLastName );
            pLastName = Abc_UtilStrsav( p->pName );
        }

        fprintf( pTable, "%d ", (int)p->AreaGlo );
        fprintf( pTable, "%d ", (int)p->RequiredGlo );
        fclose( pTable );
    }
*/
    p->pPars->FinalDelay = p->RequiredGlo;
    p->pPars->FinalArea  = p->AreaGlo;
    return 1;
}